

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O0

void __thiscall
StatusPrinter::BuildEdgeFinished
          (StatusPrinter *this,Edge *edge,int64_t end_time_millis,bool success,string *output)

{
  bool bVar1;
  reference ppNVar2;
  string *__lhs;
  ulong uVar3;
  string local_198;
  undefined1 local_178 [8];
  string final_output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_68;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_60;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_58;
  const_iterator o;
  string outputs;
  string *output_local;
  bool success_local;
  int64_t end_time_millis_local;
  Edge *edge_local;
  StatusPrinter *this_local;
  
  this->time_millis_ = end_time_millis;
  this->finished_edges_ = this->finished_edges_ + 1;
  bVar1 = Edge::use_console(edge);
  if (bVar1) {
    LinePrinter::SetConsoleLocked(&this->printer_,false);
  }
  if (*(int *)this->config_ != 0) {
    bVar1 = Edge::use_console(edge);
    if (!bVar1) {
      PrintStatus(this,edge,end_time_millis);
    }
    this->running_edges_ = this->running_edges_ + -1;
    if (!success) {
      std::__cxx11::string::string((string *)&o);
      local_60._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&edge->outputs_);
      __gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>::
      __normal_iterator<Node**>
                ((__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>> *)
                 &local_58,&local_60);
      while( true ) {
        local_68._M_current =
             (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&edge->outputs_);
        bVar1 = __gnu_cxx::operator!=(&local_58,&local_68);
        if (!bVar1) break;
        ppNVar2 = __gnu_cxx::
                  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&local_58);
        __lhs = Node::path_abi_cxx11_(*ppNVar2);
        std::operator+(&local_88,__lhs," ");
        std::__cxx11::string::operator+=((string *)&o,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        __gnu_cxx::__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
        operator++(&local_58);
      }
      bVar1 = LinePrinter::supports_color(&this->printer_);
      if (bVar1) {
        std::operator+(&local_d8,"\x1b[31mFAILED: \x1b[0m",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&o);
        std::operator+(&local_b8,&local_d8,"\n");
        LinePrinter::PrintOnNewLine(&this->printer_,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_d8);
      }
      else {
        std::operator+(&local_118,"FAILED: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&o);
        std::operator+(&local_f8,&local_118,"\n");
        LinePrinter::PrintOnNewLine(&this->printer_,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
      }
      Edge::EvaluateCommand_abi_cxx11_((string *)((long)&final_output.field_2 + 8),edge,false);
      std::operator+(&local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&final_output.field_2 + 8),"\n");
      LinePrinter::PrintOnNewLine(&this->printer_,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)(final_output.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&o);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::string((string *)local_178);
      bVar1 = LinePrinter::supports_color(&this->printer_);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_178,(string *)output);
      }
      else {
        StripAnsiEscapeCodes(&local_198,output);
        std::__cxx11::string::operator=((string *)local_178,(string *)&local_198);
        std::__cxx11::string::~string((string *)&local_198);
      }
      LinePrinter::PrintOnNewLine(&this->printer_,(string *)local_178);
      std::__cxx11::string::~string((string *)local_178);
    }
  }
  return;
}

Assistant:

void StatusPrinter::BuildEdgeFinished(Edge* edge, int64_t end_time_millis,
                                      bool success, const string& output) {
  time_millis_ = end_time_millis;
  ++finished_edges_;

  if (edge->use_console())
    printer_.SetConsoleLocked(false);

  if (config_.verbosity == BuildConfig::QUIET)
    return;

  if (!edge->use_console())
    PrintStatus(edge, end_time_millis);

  --running_edges_;

  // Print the command that is spewing before printing its output.
  if (!success) {
    string outputs;
    for (vector<Node*>::const_iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o)
      outputs += (*o)->path() + " ";

    if (printer_.supports_color()) {
        printer_.PrintOnNewLine("\x1B[31m" "FAILED: " "\x1B[0m" + outputs + "\n");
    } else {
        printer_.PrintOnNewLine("FAILED: " + outputs + "\n");
    }
    printer_.PrintOnNewLine(edge->EvaluateCommand() + "\n");
  }

  if (!output.empty()) {
    // ninja sets stdout and stderr of subprocesses to a pipe, to be able to
    // check if the output is empty. Some compilers, e.g. clang, check
    // isatty(stderr) to decide if they should print colored output.
    // To make it possible to use colored output with ninja, subprocesses should
    // be run with a flag that forces them to always print color escape codes.
    // To make sure these escape codes don't show up in a file if ninja's output
    // is piped to a file, ninja strips ansi escape codes again if it's not
    // writing to a |smart_terminal_|.
    // (Launching subprocesses in pseudo ttys doesn't work because there are
    // only a few hundred available on some systems, and ninja can launch
    // thousands of parallel compile commands.)
    string final_output;
    if (!printer_.supports_color())
      final_output = StripAnsiEscapeCodes(output);
    else
      final_output = output;

#ifdef _WIN32
    // Fix extra CR being added on Windows, writing out CR CR LF (#773)
    _setmode(_fileno(stdout), _O_BINARY);  // Begin Windows extra CR fix
#endif

    printer_.PrintOnNewLine(final_output);

#ifdef _WIN32
    _setmode(_fileno(stdout), _O_TEXT);  // End Windows extra CR fix
#endif
  }
}